

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

int32_t __thiscall icu_63::anon_unknown_0::AllSameBlocks::findMostUsed(AllSameBlocks *this)

{
  int local_24;
  int local_20;
  int32_t i;
  int32_t maxCount;
  int32_t max;
  AllSameBlocks *this_local;
  
  if (this->length == 0) {
    this_local._4_4_ = -1;
  }
  else {
    i = -1;
    local_20 = 0;
    for (local_24 = 0; local_24 < this->length; local_24 = local_24 + 1) {
      if (local_20 < this->refCounts[local_24]) {
        i = local_24;
        local_20 = this->refCounts[local_24];
      }
    }
    this_local._4_4_ = this->indexes[i];
  }
  return this_local._4_4_;
}

Assistant:

int32_t findMostUsed() const {
        if (length == 0) { return -1; }
        int32_t max = -1;
        int32_t maxCount = 0;
        for (int32_t i = 0; i < length; ++i) {
            if (refCounts[i] > maxCount) {
                max = i;
                maxCount = refCounts[i];
            }
        }
        return indexes[max];
    }